

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scapp.h
# Opt level: O1

ktx_pack_astc_quality_levels_e astcQualityLevel(char *quality)

{
  ktx_pack_astc_quality_levels_e kVar1;
  int iVar2;
  iterator iVar3;
  long lVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  undefined1 local_ff;
  undefined1 local_fe;
  undefined1 local_fd;
  ktx_pack_astc_quality_levels_e local_fc [5];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx_pack_astc_quality_levels_e>
  local_e8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx_pack_astc_quality_levels_e>
  local_c0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx_pack_astc_quality_levels_e>
  local_98;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx_pack_astc_quality_levels_e>
  local_70;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx_pack_astc_quality_levels_e>
  local_48;
  
  if (astcQualityLevel(char_const*)::astc_quality_mapping_abi_cxx11_ == '\0') {
    iVar2 = __cxa_guard_acquire(&astcQualityLevel(char_const*)::astc_quality_mapping_abi_cxx11_);
    if (iVar2 != 0) {
      local_fc[0] = KTX_PACK_ASTC_QUALITY_LEVEL_FASTEST;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx_pack_astc_quality_levels_e>
      ::pair<const_char_(&)[8],_ktx_pack_astc_quality_levels_e,_true>
                (&local_e8,(char (*) [8])"fastest",local_fc);
      local_fc[4] = 10;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx_pack_astc_quality_levels_e>
      ::pair<const_char_(&)[5],_ktx_pack_astc_quality_levels_e,_true>
                (&local_c0,(char (*) [5])"fast",local_fc + 4);
      local_fc[3] = 0x3c;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx_pack_astc_quality_levels_e>
      ::pair<const_char_(&)[7],_ktx_pack_astc_quality_levels_e,_true>
                (&local_98,(char (*) [7])"medium",local_fc + 3);
      local_fc[2] = 0x62;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx_pack_astc_quality_levels_e>
      ::pair<const_char_(&)[9],_ktx_pack_astc_quality_levels_e,_true>
                (&local_70,(char (*) [9])"thorough",local_fc + 2);
      local_fc[1] = 100;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx_pack_astc_quality_levels_e>
      ::pair<const_char_(&)[11],_ktx_pack_astc_quality_levels_e,_true>
                (&local_48,(char (*) [11])"exhaustive",local_fc + 1);
      std::
      _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,ktx_pack_astc_quality_levels_e>,std::allocator<std::pair<std::__cxx11::string_const,ktx_pack_astc_quality_levels_e>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::_Hashtable<std::pair<std::__cxx11::string_const,ktx_pack_astc_quality_levels_e>const*>
                ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,ktx_pack_astc_quality_levels_e>,std::allocator<std::pair<std::__cxx11::string_const,ktx_pack_astc_quality_levels_e>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)&astcQualityLevel(char_const*)::astc_quality_mapping_abi_cxx11_,&local_e8,
                 &stack0xffffffffffffffe0,0,&local_fd,&local_fe,&local_ff);
      lVar4 = -200;
      paVar5 = &local_48.first.field_2;
      do {
        if (paVar5 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(&paVar5->_M_allocated_capacity)[-2]) {
          operator_delete((long *)(&paVar5->_M_allocated_capacity)[-2],
                          paVar5->_M_allocated_capacity + 1);
        }
        paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(&paVar5->_M_allocated_capacity + -5);
        lVar4 = lVar4 + 0x28;
      } while (lVar4 != 0);
      __cxa_atexit(std::
                   unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx_pack_astc_quality_levels_e,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx_pack_astc_quality_levels_e>_>_>
                   ::~unordered_map,&astcQualityLevel(char_const*)::astc_quality_mapping_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&astcQualityLevel(char_const*)::astc_quality_mapping_abi_cxx11_);
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,quality,(allocator<char> *)local_fc);
  iVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx_pack_astc_quality_levels_e>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx_pack_astc_quality_levels_e>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&astcQualityLevel(char_const*)::astc_quality_mapping_abi_cxx11_._M_h,
                 &local_e8.first);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8.first._M_dataplus._M_p != &local_e8.first.field_2) {
    operator_delete(local_e8.first._M_dataplus._M_p,local_e8.first.field_2._M_allocated_capacity + 1
                   );
  }
  if (iVar3.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx_pack_astc_quality_levels_e>,_true>
      ._M_cur == (__node_type *)0x0) {
    kVar1 = KTX_PACK_ASTC_QUALITY_LEVEL_MEDIUM;
  }
  else {
    kVar1 = *(ktx_pack_astc_quality_levels_e *)
             ((long)iVar3.
                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx_pack_astc_quality_levels_e>,_true>
                    ._M_cur + 0x28);
  }
  return kVar1;
}

Assistant:

ktx_pack_astc_quality_levels_e
astcQualityLevel(const char *quality) {

    static std::unordered_map<std::string,
                              ktx_pack_astc_quality_levels_e> astc_quality_mapping{
        {"fastest", KTX_PACK_ASTC_QUALITY_LEVEL_FASTEST},
        {"fast", KTX_PACK_ASTC_QUALITY_LEVEL_FAST},
        {"medium", KTX_PACK_ASTC_QUALITY_LEVEL_MEDIUM},
        {"thorough", KTX_PACK_ASTC_QUALITY_LEVEL_THOROUGH},
        {"exhaustive", KTX_PACK_ASTC_QUALITY_LEVEL_EXHAUSTIVE}
    };

  auto opt = astc_quality_mapping.find(quality);

  if (opt != astc_quality_mapping.end())
      return opt->second;

  return KTX_PACK_ASTC_QUALITY_LEVEL_MEDIUM;
}